

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

size_t __thiscall
edition_unittest::TestCamelCaseFieldNames::ByteSizeLong(TestCamelCaseFieldNames *this)

{
  RepeatedPtrField<edition_unittest::ForeignMessage> *this_00;
  int iVar1;
  anon_union_192_1_493b367e_for_TestCamelCaseFieldNames_3 aVar2;
  uint uVar3;
  size_t sVar4;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar5;
  void **ppvVar6;
  const_iterator cVar7;
  size_t sVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  
  sVar4 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeatedprimitivefield_,1,
                     &(this->field_0)._impl_._repeatedprimitivefield_cached_byte_size_);
  uVar3 = *(uint *)((long)&this->field_0 + 0x28);
  lVar12 = sVar4 + uVar3;
  uVar11 = 0;
  uVar10 = 0;
  if (0 < (int)uVar3) {
    uVar11 = uVar3;
    uVar10 = 0;
  }
  for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
    pVVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       (&(this->field_0)._impl_.repeatedstringfield_.super_RepeatedPtrFieldBase,
                        uVar10);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(pVVar5);
    lVar12 = lVar12 + sVar4;
  }
  sVar4 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeatedenumfield_,1,
                     &(this->field_0)._impl_._repeatedenumfield_cached_byte_size_);
  lVar12 = (long)*(int *)((long)&this->field_0 + 0x58) + sVar4 + lVar12;
  this_00 = &(this->field_0)._impl_.repeatedmessagefield_;
  ppvVar6 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&this_00->super_RepeatedPtrFieldBase);
  cVar7 = google::protobuf::RepeatedPtrField<edition_unittest::ForeignMessage>::end(this_00);
  for (; ppvVar6 != cVar7.it_; ppvVar6 = ppvVar6 + 1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSize<edition_unittest::ForeignMessage>((ForeignMessage *)*ppvVar6);
    lVar12 = lVar12 + sVar4;
  }
  uVar3 = *(uint *)((long)&this->field_0 + 0x70);
  lVar12 = lVar12 + (ulong)uVar3;
  uVar10 = 0;
  uVar11 = 0;
  if (0 < (int)uVar3) {
    uVar11 = uVar3;
  }
  for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
    pVVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       (&(this->field_0)._impl_.repeatedstringpiecefield_.super_RepeatedPtrFieldBase
                        ,uVar10);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(pVVar5);
    lVar12 = lVar12 + sVar4;
  }
  uVar3 = *(uint *)((long)&this->field_0 + 0x88);
  sVar4 = lVar12 + (ulong)uVar3;
  uVar10 = 0;
  uVar11 = 0;
  if (0 < (int)uVar3) {
    uVar11 = uVar3;
  }
  for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
    pVVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       (&(this->field_0)._impl_.repeatedcordfield_.super_RepeatedPtrFieldBase,uVar10
                       );
    sVar8 = google::protobuf::internal::WireFormatLite::StringSize(pVVar5);
    sVar4 = sVar4 + sVar8;
  }
  aVar2 = this->field_0;
  if (((undefined1  [192])aVar2 & (undefined1  [192])0x3f) != (undefined1  [192])0x0) {
    if (((undefined1  [192])aVar2 & (undefined1  [192])0x1) != (undefined1  [192])0x0) {
      lVar12 = *(long *)(((ulong)(this->field_0)._impl_.stringfield_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar3 = (uint)lVar12 | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar4 = sVar4 + lVar12 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [192])aVar2 & (undefined1  [192])0x2) != (undefined1  [192])0x0) {
      lVar12 = *(long *)(((ulong)(this->field_0)._impl_.stringpiecefield_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar3 = (uint)lVar12 | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar4 = sVar4 + lVar12 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [192])aVar2 & (undefined1  [192])0x4) != (undefined1  [192])0x0) {
      sVar8 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.cordfield_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar4 = sVar4 + sVar8 + 1;
    }
    if (((undefined1  [192])aVar2 & (undefined1  [192])0x8) != (undefined1  [192])0x0) {
      sVar8 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::ForeignMessage>((this->field_0)._impl_.messagefield_);
      sVar4 = sVar4 + sVar8 + 1;
    }
    if (((undefined1  [192])aVar2 & (undefined1  [192])0x10) != (undefined1  [192])0x0) {
      uVar9 = (long)(this->field_0)._impl_.primitivefield_ | 1;
      lVar12 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar12 * 9 + 0x89U >> 6);
    }
    if (((undefined1  [192])aVar2 & (undefined1  [192])0x20) != (undefined1  [192])0x0) {
      uVar9 = (long)(this->field_0)._impl_.enumfield_ | 1;
      lVar12 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar12 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar4 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar4,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t TestCamelCaseFieldNames::ByteSizeLong() const {
  const TestCamelCaseFieldNames& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestCamelCaseFieldNames)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 RepeatedPrimitiveField = 7;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_repeatedprimitivefield(), 1,
              this_._impl_._repeatedprimitivefield_cached_byte_size_);
    }
    // repeated string RepeatedStringField = 8;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_repeatedstringfield().size());
      for (int i = 0, n = this_._internal_repeatedstringfield().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeatedstringfield().Get(i));
      }
    }
    // repeated .edition_unittest.ForeignEnum RepeatedEnumField = 9;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeatedenumfield(), 1, this_._impl_._repeatedenumfield_cached_byte_size_);
    }
    // repeated .edition_unittest.ForeignMessage RepeatedMessageField = 10;
    {
      total_size += 1UL * this_._internal_repeatedmessagefield_size();
      for (const auto& msg : this_._internal_repeatedmessagefield()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated string RepeatedStringPieceField = 11 [ctype = STRING_PIECE];
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_repeatedstringpiecefield().size());
      for (int i = 0, n = this_._internal_repeatedstringpiecefield().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeatedstringpiecefield().Get(i));
      }
    }
    // repeated string RepeatedCordField = 12 [ctype = CORD];
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_repeatedcordfield().size());
      for (int i = 0, n = this_._internal_repeatedcordfield().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeatedcordfield().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    // string StringField = 2;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_stringfield());
    }
    // string StringPieceField = 5 [ctype = STRING_PIECE];
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_stringpiecefield());
    }
    // string CordField = 6 [ctype = CORD];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_cordfield());
    }
    // .edition_unittest.ForeignMessage MessageField = 4;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.messagefield_);
    }
    // int32 PrimitiveField = 1;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_primitivefield());
    }
    // .edition_unittest.ForeignEnum EnumField = 3;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_enumfield());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}